

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *centre,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVec2 local_38;
  ImVec2 *local_30;
  ImVec2 *c;
  int a;
  int a_max_of_12_local;
  int a_min_of_12_local;
  float radius_local;
  ImVec2 *centre_local;
  ImDrawList *this_local;
  
  c._4_4_ = a_max_of_12;
  a = a_min_of_12;
  a_max_of_12_local = (int)radius;
  _a_min_of_12_local = centre;
  centre_local = (ImVec2 *)this;
  if (((radius == 0.0) && (!NAN(radius))) || (a_max_of_12 < a_min_of_12)) {
    ImVector<ImVec2>::push_back(&this->_Path,centre);
  }
  else {
    ImVector<ImVec2>::reserve(&this->_Path,(this->_Path).Size + (a_max_of_12 - a_min_of_12) + 1);
    for (c._0_4_ = a; (int)c <= c._4_4_; c._0_4_ = (int)c + 1) {
      local_30 = this->_Data->CircleVtx12 + (int)c % 0xc;
      ImVec2::ImVec2(&local_38,local_30->x * (float)a_max_of_12_local + _a_min_of_12_local->x,
                     local_30->y * (float)a_max_of_12_local + _a_min_of_12_local->y);
      ImVector<ImVec2>::push_back(&this->_Path,&local_38);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(centre);
        return;
    }
    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->CircleVtx12[a % IM_ARRAYSIZE(_Data->CircleVtx12)];
        _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
    }
}